

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMemory.cpp
# Opt level: O0

void * xercesc_4_0::XMemory::operator_new(size_t size,MemoryManager *manager)

{
  int iVar1;
  XMLSize_t XVar2;
  undefined4 extraout_var;
  void *block;
  size_t headerSize;
  MemoryManager *manager_local;
  size_t size_local;
  
  if (manager != (MemoryManager *)0x0) {
    XVar2 = XMLPlatformUtils::alignPointerForNewBlockAllocation(8);
    iVar1 = (*manager->_vptr_MemoryManager[3])(manager,XVar2 + size);
    *(undefined8 *)CONCAT44(extraout_var,iVar1) = manager;
    return (void *)((long)CONCAT44(extraout_var,iVar1) + XVar2);
  }
  __assert_fail("manager != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMemory.cpp"
                ,0x3f,"static void *xercesc_4_0::XMemory::operator new(size_t, MemoryManager *)");
}

Assistant:

void* XMemory::operator new(size_t size, MemoryManager* manager)
{
    assert(manager != 0);
	
    size_t headerSize = XMLPlatformUtils::alignPointerForNewBlockAllocation(
       sizeof(MemoryManager*));
       
    void* const block = manager->allocate(headerSize + size);
    *(MemoryManager**)block = manager;

    return (char*)block + headerSize;
}